

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_STATUS ref_subdiv_inspect(REF_SUBDIV ref_subdiv)

{
  REF_CELL ref_cell;
  uint uVar1;
  REF_INT RVar2;
  REF_CELL *ppRVar3;
  long lVar4;
  int cell;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  ppRVar3 = ref_subdiv->grid->cell + 8;
  for (lVar4 = 8; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    ref_cell = *ppRVar3;
    uVar5 = 0;
    while (cell = (int)uVar5, cell < ref_cell->max) {
      if (ref_cell->c2n[(long)ref_cell->size_per * (long)cell] != -1) {
        uVar1 = ref_subdiv_map(ref_subdiv,ref_cell,cell);
        printf(" group %d cell %d map %d\n",lVar4,uVar5,(ulong)uVar1);
        for (lVar7 = 0; lVar7 < ref_cell->edge_per; lVar7 = lVar7 + 1) {
          RVar2 = ref_subdiv_c2e(ref_subdiv,ref_cell,(REF_INT)lVar7,cell);
          lVar6 = (long)ref_cell->size_per * (long)cell;
          printf("  edge %d nodes %d %d mark %d\n",(long)RVar2,
                 (ulong)(uint)ref_cell->c2n[ref_cell->e2n[lVar7 * 2] + lVar6],
                 (ulong)(uint)ref_cell->c2n[(long)(int)lVar6 + (long)ref_cell->e2n[lVar7 * 2 + 1]],
                 (ulong)(uint)ref_subdiv->mark[RVar2]);
        }
      }
      uVar5 = (ulong)(cell + 1);
    }
    ppRVar3 = ref_subdiv->grid->cell + lVar4 + 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_inspect(REF_SUBDIV ref_subdiv) {
  REF_INT group, cell, cell_edge, edge, map;
  REF_CELL ref_cell;

  each_ref_grid_3d_ref_cell(ref_subdiv_grid(ref_subdiv), group, ref_cell) {
    each_ref_cell_valid_cell(ref_cell, cell) {
      map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
      printf(" group %d cell %d map %d\n", group, cell, map);
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        edge = ref_subdiv_c2e(ref_subdiv, ref_cell, cell_edge, cell);
        printf("  edge %d nodes %d %d mark %d\n", edge,
               ref_cell_e2n(ref_cell, 0, cell_edge, cell),
               ref_cell_e2n(ref_cell, 1, cell_edge, cell),
               ref_subdiv_mark(ref_subdiv, edge));
      }
    }
  }
  return REF_SUCCESS;
}